

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::udp_socket::set_proxy_settings
          (udp_socket *this,proxy_settings *ps,alert_manager *alerts,resolver_interface *resolver,
          bool send_local_ep)

{
  bool bVar1;
  element_type *peVar2;
  int __fd;
  io_context local_40;
  undefined1 local_29;
  resolver_interface *prStack_28;
  bool send_local_ep_local;
  resolver_interface *resolver_local;
  alert_manager *alerts_local;
  proxy_settings *ps_local;
  udp_socket *this_local;
  
  local_29 = send_local_ep;
  prStack_28 = resolver;
  resolver_local = (resolver_interface *)alerts;
  alerts_local = (alert_manager *)ps;
  ps_local = (proxy_settings *)this;
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_socks5_connection);
  __fd = (int)ps;
  if (bVar1) {
    peVar2 = ::std::
             __shared_ptr_access<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_socks5_connection);
    socks5::close(peVar2,__fd);
    ::std::__shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->m_socks5_connection).
                super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>);
  }
  proxy_settings::operator=(&this->m_proxy_settings,(proxy_settings *)alerts_local);
  if (((this->field_0xf0 & 1) == 0) &&
     ((*(char *)&(alerts_local->m_condition)._M_mutex.
                 super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
       '\x02' ||
      (*(char *)&(alerts_local->m_condition)._M_mutex.
                 super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
       '\x03')))) {
    ::std::
    make_shared<libtorrent::aux::socks5,boost::asio::io_context&,libtorrent::aux::listen_socket_handle&,libtorrent::aux::alert_manager&,libtorrent::aux::resolver_interface&,bool_const&>
              (&local_40,(listen_socket_handle *)this->m_ioc,(alert_manager *)&this->m_listen_socket
               ,resolver_local,(bool *)prStack_28);
    ::std::shared_ptr<libtorrent::aux::socks5>::operator=
              (&this->m_socks5_connection,(shared_ptr<libtorrent::aux::socks5> *)&local_40);
    ::std::shared_ptr<libtorrent::aux::socks5>::~shared_ptr
              ((shared_ptr<libtorrent::aux::socks5> *)&local_40);
    peVar2 = ::std::
             __shared_ptr_access<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_socks5_connection);
    socks5::start(peVar2,(proxy_settings *)alerts_local);
  }
  return;
}

Assistant:

void udp_socket::set_proxy_settings(aux::proxy_settings const& ps
	, aux::alert_manager& alerts, aux::resolver_interface& resolver, bool const send_local_ep)
{
	TORRENT_ASSERT(is_single_thread());

	if (m_socks5_connection)
	{
		m_socks5_connection->close();
		m_socks5_connection.reset();
	}

	m_proxy_settings = ps;

	if (m_abort) return;

	if (ps.type == settings_pack::socks5
		|| ps.type == settings_pack::socks5_pw)
	{
		// connect to socks5 server and open up the UDP tunnel

		m_socks5_connection = std::make_shared<socks5>(m_ioc
			, m_listen_socket, alerts, resolver, send_local_ep);
		m_socks5_connection->start(ps);
	}
}